

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  byte bVar1;
  ushort uVar2;
  sqlite3 *db;
  u8 *zString;
  Schema *pSVar3;
  bool bVar4;
  u32 uVar5;
  int iVar6;
  int iVar7;
  int p2;
  int p2_00;
  int regOut;
  int p2_01;
  int p2_02;
  int p1;
  int p1_00;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Vdbe *p;
  void *p_00;
  CollSeq *zP4;
  Schema **ppSVar12;
  Op *pOVar13;
  int iVar14;
  int iVar15;
  Index *pIdx;
  short *psVar16;
  long lVar17;
  uint p1_01;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  Index *pIVar22;
  
  db = pParse->db;
  iVar14 = iMem + 8;
  iVar6 = pParse->nMem;
  if (pParse->nMem <= iVar14) {
    iVar6 = iVar14;
  }
  pParse->nMem = iVar6;
  p = sqlite3GetVdbe(pParse);
  if ((pTab != (Table *)0x0 && p != (Vdbe *)0x0) && (pTab->tnum != 0)) {
    zString = (u8 *)pTab->zName;
    iVar6 = patternCompare((u8 *)"sqlite\\_%",zString,&likeInfoNorm,0x5c);
    if (iVar6 != 0) {
      if (pTab->pSchema == (Schema *)0x0) {
        iVar6 = -1000000;
      }
      else {
        iVar6 = -1;
        ppSVar12 = &db->aDb->pSchema;
        do {
          iVar6 = iVar6 + 1;
          pSVar3 = *ppSVar12;
          ppSVar12 = ppSVar12 + 4;
        } while (pSVar3 != pTab->pSchema);
      }
      iVar7 = sqlite3AuthCheck(pParse,0x1c,(char *)zString,(char *)0x0,db->aDb[iVar6].zDbSName);
      if (iVar7 == 0) {
        p2 = iMem + 4;
        p2_00 = iMem + 5;
        regOut = iMem + 7;
        sqlite3TableLock(pParse,iVar6,pTab->tnum,'\0',pTab->zName);
        iVar7 = iTab + 2;
        if (iTab + 2 < pParse->nTab) {
          iVar7 = pParse->nTab;
        }
        pParse->nTab = iVar7;
        sqlite3OpenTable(pParse,iTab,iVar6,pTab,0x6c);
        pcVar20 = pTab->zName;
        iVar7 = sqlite3VdbeAddOp3(p,0x6e,0,p2_00,0);
        sqlite3VdbeChangeP4(p,iVar7,pcVar20,0);
        pIdx = pTab->pIndex;
        if (pIdx == (Index *)0x0) {
          bVar4 = true;
        }
        else {
          iVar7 = iMem + 1;
          p2_01 = iMem + 2;
          p2_02 = iMem + 3;
          p1 = iTab + 1;
          p1_00 = iMem + 0xb;
          bVar4 = true;
          do {
            if (pOnlyIdx == (Index *)0x0 || pIdx == pOnlyIdx) {
              if (pIdx->pPartIdxWhere == (Expr *)0x0) {
                bVar4 = false;
              }
              if (((pTab->tabFlags & 0x20) == 0) || ((*(ushort *)&pIdx->field_0x63 & 3) != 2)) {
                p1_01 = (uint)pIdx->nColumn;
                pcVar20 = pIdx->zName;
                if ((pIdx->field_0x63 & 8) == 0) {
                  uVar18 = (uint)pIdx->nColumn;
                }
                else {
                  uVar18 = (uint)pIdx->nKeyCol;
                }
              }
              else {
                uVar18 = (uint)pIdx->nKeyCol;
                pcVar20 = pTab->zName;
                p1_01 = uVar18;
              }
              iVar8 = sqlite3VdbeAddOp3(p,0x6e,0,iMem + 6,0);
              sqlite3VdbeChangeP4(p,iVar8,pcVar20,0);
              iVar8 = iVar14 + uVar18 + -1;
              if (iVar8 < pParse->nMem) {
                iVar8 = pParse->nMem;
              }
              pParse->nMem = iVar8;
              sqlite3VdbeAddOp3(p,0x6c,p1,pIdx->tnum,iVar6);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              sqlite3VdbeAddOp3(p,0x5d,p1,p2,0);
              sqlite3VdbeAddOp3(p,0x46,p1_01,p2_01,0);
              sqlite3VdbeAddOp3(p,0x46,(uint)pIdx->nKeyCol,p2_02,0);
              iVar8 = sqlite3VdbeAddOp3(p,0x3f,0,p2_01,iVar7);
              sqlite3VdbeChangeP4(p,iVar8,&statInitFuncdef.nArg,-8);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 3;
              }
              iVar9 = sqlite3VdbeAddOp3(p,0x24,p1,0,0);
              sqlite3VdbeAddOp3(p,0x46,0,p2_01,0);
              iVar8 = p->nOp;
              if (1 < uVar18) {
                uVar18 = uVar18 - 1;
                iVar10 = pParse->nLabel + -1;
                pParse->nLabel = iVar10;
                p_00 = sqlite3DbMallocRawNN(db,(ulong)uVar18 << 2);
                if (p_00 != (void *)0x0) {
                  sqlite3VdbeAddOp3(p,0xb,0,0,0);
                  iVar8 = p->nOp;
                  if (((uVar18 == 1) && (pIdx->nKeyCol == 1)) && (pIdx->onError != '\0')) {
                    sqlite3VdbeAddOp3(p,0x33,iVar14,iVar10,0);
                  }
                  uVar19 = 1;
                  if (1 < (int)uVar18) {
                    uVar19 = (ulong)uVar18;
                  }
                  uVar21 = 0;
                  do {
                    zP4 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar21]);
                    iVar11 = (int)uVar21;
                    sqlite3VdbeAddOp3(p,0x46,iVar11,p2_01,0);
                    sqlite3VdbeAddOp3(p,0x5a,p1,iVar11,p2);
                    iVar11 = sqlite3VdbeAddOp3(p,0x34,p2,0,iVar14 + iVar11);
                    sqlite3VdbeChangeP4(p,iVar11,(char *)zP4,-2);
                    *(int *)((long)p_00 + uVar21 * 4) = iVar11;
                    if (0 < (long)p->nOp) {
                      p->aOp[(long)p->nOp + -1].p5 = 0x80;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar19 != uVar21);
                  sqlite3VdbeAddOp3(p,0x46,uVar18,p2_01,0);
                  sqlite3VdbeAddOp3(p,0xb,0,iVar10,0);
                  pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (p->db->mallocFailed == '\0') {
                    iVar11 = iVar8;
                    if (iVar8 < 1) {
                      iVar11 = p->nOp;
                    }
                    pOVar13 = p->aOp + (long)iVar11 + -1;
                  }
                  pOVar13->p2 = p->nOp;
                  uVar21 = 0;
                  do {
                    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
                    if (p->db->mallocFailed == '\0') {
                      iVar11 = *(int *)((long)p_00 + uVar21 * 4);
                      iVar15 = p->nOp + -1;
                      if (-1 < iVar11) {
                        iVar15 = iVar11;
                      }
                      pOVar13 = p->aOp + iVar15;
                    }
                    pOVar13->p2 = p->nOp;
                    sqlite3VdbeAddOp3(p,0x5a,p1,(int)uVar21,iVar14 + (int)uVar21);
                    uVar21 = uVar21 + 1;
                  } while (uVar19 != uVar21);
                  sqlite3VdbeResolveLabel(p,iVar10);
                  sqlite3DbFreeNN(db,p_00);
                }
                if (p_00 == (void *)0x0) goto LAB_00194283;
              }
              if ((pTab->tabFlags & 0x20) == 0) {
                sqlite3VdbeAddOp3(p,0x87,p1,p2_02,0);
              }
              else {
                for (pIVar22 = pIdx->pTable->pIndex;
                    (pIVar22 != (Index *)0x0 && ((*(ushort *)&pIVar22->field_0x63 & 3) != 2));
                    pIVar22 = pIVar22->pNext) {
                }
                iVar10 = sqlite3GetTempRange(pParse,(uint)pIVar22->nKeyCol);
                uVar2 = pIVar22->nKeyCol;
                if (uVar2 != 0) {
                  uVar19 = 0;
                  do {
                    iVar11 = -1;
                    if (pIdx->nColumn != 0) {
                      psVar16 = pIdx->aiColumn;
                      lVar17 = 0;
                      do {
                        if (*psVar16 == pIVar22->aiColumn[uVar19]) {
                          iVar11 = (int)lVar17 >> 0x10;
                          break;
                        }
                        lVar17 = lVar17 + 0x10000;
                        psVar16 = psVar16 + 1;
                      } while ((ulong)pIdx->nColumn * 0x10000 != lVar17);
                    }
                    sqlite3VdbeAddOp3(p,0x5a,p1,iVar11,(int)uVar19 + iVar10);
                    uVar19 = uVar19 + 1;
                    uVar2 = pIVar22->nKeyCol;
                  } while (uVar19 < uVar2);
                }
                sqlite3VdbeAddOp3(p,0x5c,iVar10,(uint)uVar2,p2_02);
                uVar2 = pIVar22->nKeyCol;
                if (uVar2 == 1) {
                  if (iVar10 != 0) {
                    bVar1 = pParse->nTempReg;
                    if ((ulong)bVar1 < 8) {
                      pParse->nTempReg = bVar1 + 1;
                      pParse->aTempReg[bVar1] = iVar10;
                    }
                  }
                }
                else if (pParse->nRangeReg < (int)(uint)uVar2) {
                  pParse->nRangeReg = (uint)uVar2;
                  pParse->iRangeReg = iVar10;
                }
              }
              iVar10 = sqlite3VdbeAddOp3(p,0x3f,1,iVar7,p2);
              sqlite3VdbeChangeP4(p,iVar10,&statPushFuncdef.nArg,-8);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 3;
              }
              sqlite3VdbeAddOp3(p,5,p1,iVar8,0);
              callStatGet(p,iVar7,0,regOut);
              iVar8 = sqlite3VdbeAddOp3(p,0x5c,p2_00,3,p2);
              sqlite3VdbeChangeP4(p,iVar8,"BBB",0);
              sqlite3VdbeAddOp3(p,0x79,iStatCur,iMem,0);
              sqlite3VdbeAddOp3(p,0x7a,iStatCur,p2,iMem);
              iVar8 = p->nOp;
              if (0 < (long)iVar8) {
                p->aOp[(long)iVar8 + -1].p5 = 8;
              }
              iVar11 = p1_01 + p1_00;
              uVar5 = pTab->tabFlags;
              iVar10 = pParse->nMem;
              if (pParse->nMem <= iVar11) {
                iVar10 = iVar11;
              }
              pParse->nMem = iVar10;
              callStatGet(p,iVar7,1,iVar11);
              iVar10 = sqlite3VdbeAddOp3(p,0x32,iVar11,0,0);
              callStatGet(p,iVar7,2,regOut);
              callStatGet(p,iVar7,3,iVar14);
              callStatGet(p,iVar7,4,iMem + 9);
              iVar11 = sqlite3VdbeAddOp3(p,(uint)((uVar5 & 0x20) == 0) * 3 + 0x1c,iTab,iVar8,iVar11)
              ;
              if (p->db->mallocFailed == '\0') {
                pOVar13 = p->aOp;
                pOVar13[iVar11].p4type = -3;
                pOVar13[iVar11].p4.i = 0;
              }
              if (p1_01 != 0) {
                uVar18 = 0;
                do {
                  sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iTab,uVar18,uVar18 + p1_00);
                  uVar18 = uVar18 + 1;
                } while (p1_01 != uVar18);
              }
              sqlite3VdbeAddOp3(p,0x5c,p1_00,p1_01,iMem + 10);
              sqlite3VdbeAddOp3(p,0x5c,p2_00,6,p2);
              sqlite3VdbeAddOp3(p,0x79,iStatCur + 1,iMem,0);
              sqlite3VdbeAddOp3(p,0x7a,iStatCur + 1,p2,iMem);
              sqlite3VdbeAddOp3(p,0xb,1,iVar8,0);
              iVar8 = p->nOp;
              if (p->db->mallocFailed == '\0') {
                if (iVar10 < 0) {
                  iVar10 = iVar8 + -1;
                }
                p->aOp[iVar10].p2 = iVar8;
                if (iVar9 < 0) {
                  iVar9 = iVar8 + -1;
                }
                pOVar13 = p->aOp + iVar9;
              }
              else {
                pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
                DAT_00210a70 = iVar8;
              }
              pOVar13->p2 = iVar8;
            }
LAB_00194283:
            pIdx = pIdx->pNext;
          } while (pIdx != (Index *)0x0);
        }
        if ((pOnlyIdx == (Index *)0x0) && (bVar4)) {
          sqlite3VdbeAddOp3(p,0x5d,iTab,regOut,0);
          iVar14 = sqlite3VdbeAddOp3(p,0x14,regOut,0,0);
          sqlite3VdbeAddOp3(p,0x49,0,iMem + 6,0);
          iVar6 = sqlite3VdbeAddOp3(p,0x5c,p2_00,3,p2);
          sqlite3VdbeChangeP4(p,iVar6,"BBB",0);
          sqlite3VdbeAddOp3(p,0x79,iStatCur,iMem,0);
          sqlite3VdbeAddOp3(p,0x7a,iStatCur,p2,iMem);
          iVar6 = p->nOp;
          if (0 < (long)iVar6) {
            p->aOp[(long)iVar6 + -1].p5 = 8;
          }
          if (p->db->mallocFailed == '\0') {
            iVar7 = iVar6 + -1;
            if (-1 < iVar14) {
              iVar7 = iVar14;
            }
            pOVar13 = p->aOp + iVar7;
          }
          else {
            pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar13->p2 = iVar6;
        }
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat4 = iMem++;       /* Register to hold Stat4Accum object */
  int regChng = iMem++;        /* Index of changed index field */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
#endif
  int regTemp = iMem++;        /* Temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  Table *pStat1 = 0; 
#endif

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( pTab->tnum==0 ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strlike("sqlite\\_%", pTab->zName, '\\')==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  if( db->xPreUpdateCallback ){
    pStat1 = (Table*)sqlite3DbMallocZero(db, sizeof(Table) + 13);
    if( pStat1==0 ) return;
    pStat1->zName = (char*)&pStat1[1];
    memcpy(pStat1->zName, "sqlite_stat1", 13);
    pStat1->nCol = 3;
    pStat1->iPKey = -1;
    sqlite3VdbeAddOp4(pParse->pVdbe, OP_Noop, 0, 0, 0,(char*)pStat1,P4_DYNBLOB);
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level. 
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeLoadString(v, regTabname, pTab->zName);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeLoadString(v, regIdxname, zIdxName);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate 
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of 
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    ** 
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) the number of rows in the index,
    **
    **
    ** The third argument is only used for STAT3 and STAT4
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regStat4+3);
#endif
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat4+1);
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regStat4+2);
    sqlite3VdbeAddOp4(v, OP_Function0, 0, regStat4+1, regStat4,
                     (char*)&statInitFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(pParse);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRawNN(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip 
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        aGotoChng[i] = 
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeGoto(v, endDistinctTest);
  
  
      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }
  
    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT34 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT34 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    assert( regRowid==(regStat4+2) );
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
      int j, k, regKey;
      regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
      for(j=0; j<pPk->nKeyCol; j++){
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[j]);
        assert( k>=0 && k<pIdx->nColumn );
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
        VdbeComment((v, "%s", pTab->aCol[pPk->aiColumn[j]].zName));
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
      sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
    }
#endif
    assert( regChng==(regStat4+1) );
    sqlite3VdbeAddOp4(v, OP_Function0, 1, regStat4, regTemp,
                     (char*)&statPushFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);
    sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);

    /* Add the entry to the stat1 table. */
    callStatGet(v, regStat4, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat3 or stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    {
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(v, regStat4, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(v, regStat4, STAT_GET_NEQ, regEq);
      callStatGet(v, regStat4, STAT_GET_NLT, regLt);
      callStatGet(v, regStat4, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      VdbeCoverage(v);
#ifdef SQLITE_ENABLE_STAT3
      sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, 0, regSample);
#else
      for(i=0; i<nCol; i++){
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, i, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
#endif
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}